

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O2

Frag __thiscall duckdb_re2::Compiler::Copy(Compiler *this,Frag arg)

{
  Compiler *this_00;
  Frag FVar1;
  Compiler local_188;
  
  this->failed_ = true;
  this_00 = &local_188;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
  std::operator<<((ostream *)this_00,"Compiler::Copy called!");
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
  FVar1 = NoMatch(this_00);
  FVar1._8_8_ = FVar1._8_8_ & 0xffffffffff;
  return FVar1;
}

Assistant:

Frag Compiler::Copy(Frag arg) {
  // We're using WalkExponential; there should be no copying.
  failed_ = true;
  LOG(DFATAL) << "Compiler::Copy called!";
  return NoMatch();
}